

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)14>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  long lVar2;
  byte bVar3;
  
  if (0 < count) {
    lVar2 = 0;
    do {
      bVar3 = (byte)*(undefined2 *)(src + lVar2 + (long)index * 2);
      pfVar1 = &buffer->r + lVar2 * 2;
      *pfVar1 = (float)(byte)(((byte)((ushort)*(undefined2 *)(src + lVar2 + (long)index * 2) >> 8) &
                              0xf) * '\x11') * 0.003921569;
      pfVar1[1] = (float)(byte)((bVar3 >> 4) * '\x11') * 0.003921569;
      pfVar1[2] = (float)(byte)((bVar3 & 0xf) * '\x11') * 0.003921569;
      pfVar1[3] = 1.0;
      lVar2 = lVar2 + 2;
    } while ((ulong)(uint)count * 2 != lVar2);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}